

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O3

void __thiscall
cmCTestBuildHandler::GenerateXMLLogScraped(cmCTestBuildHandler *this,cmXMLWriter *xml)

{
  string *path;
  bool bVar1;
  cmCTest *this_00;
  pointer pcVar2;
  int iVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  long lVar7;
  pointer pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer pcVar10;
  char *pcVar11;
  pointer pcVar12;
  int iVar13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string srcdir;
  string local_100;
  int local_cc;
  cmCTestBuildHandler *local_c8;
  int local_bc;
  ulong local_b8;
  string local_b0;
  string local_90;
  string local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  iVar6 = this->MaxErrors;
  iVar13 = this->MaxWarnings;
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  paVar9 = &local_100.field_2;
  local_100._M_dataplus._M_p = (pointer)paVar9;
  local_c8 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"SourceDirectory","");
  cmCTest::GetCTestConfiguration(&local_b0,this_00,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar9) {
    operator_delete(local_100._M_dataplus._M_p,
                    CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                             local_100.field_2._M_local_buf[0]) + 1);
  }
  cmsys::SystemTools::CollapseFullPath(&local_90,&local_b0);
  local_100._M_dataplus._M_p = (pointer)0x1;
  local_100.field_2._M_local_buf[0] = '/';
  local_50._M_len = local_90._M_string_length;
  local_50._M_str = local_90._M_dataplus._M_p;
  local_40 = 1;
  views._M_len = 2;
  views._M_array = &local_50;
  local_100._M_string_length = (size_type)paVar9;
  local_38 = paVar9;
  cmCatViews_abi_cxx11_(&local_70,views);
  std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pcVar12 = (local_c8->ErrorsAndWarnings).
            super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pcVar8 = (local_c8->ErrorsAndWarnings).
           super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar12 != pcVar8) {
    do {
      paVar9 = &local_100.field_2;
      if (iVar6 == 0 && iVar13 == 0) break;
      bVar1 = pcVar12->Error;
      iVar3 = iVar13;
      if (bVar1 != false) {
        iVar3 = iVar6;
      }
      local_cc = iVar13;
      if (iVar3 != 0) {
        local_b8 = (ulong)(bVar1 ^ 1);
        pcVar11 = "Warning";
        if (bVar1 != false) {
          pcVar11 = "Error";
        }
        local_100._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_100,pcVar11,pcVar11 + local_b8 * 2 + 5);
        cmXMLWriter::StartElement(xml,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar9) {
          operator_delete(local_100._M_dataplus._M_p,
                          CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                   local_100.field_2._M_local_buf[0]) + 1);
        }
        local_100._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"BuildLogLine","");
        cmXMLWriter::Element<int>(xml,&local_100,&pcVar12->LogLine);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar9) {
          operator_delete(local_100._M_dataplus._M_p,
                          CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                   local_100.field_2._M_local_buf[0]) + 1);
        }
        local_100._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Text","");
        cmXMLWriter::StartElement(xml,&local_100);
        cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar12->Text);
        cmXMLWriter::EndElement(xml);
        local_bc = iVar6;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar9) {
          operator_delete(local_100._M_dataplus._M_p,
                          CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                   local_100.field_2._M_local_buf[0]) + 1);
        }
        pcVar2 = (local_c8->ErrorWarningFileLineRegex).
                 super__Vector_base<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pcVar10 = (local_c8->ErrorWarningFileLineRegex).
                       super__Vector_base<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
                       ._M_impl.super__Vector_impl_data._M_start; pcVar10 != pcVar2;
            pcVar10 = pcVar10 + 1) {
          bVar5 = cmsys::RegularExpression::find
                            (&pcVar10->RegularExpression,(pcVar12->Text)._M_dataplus._M_p,
                             &(pcVar10->RegularExpression).regmatch);
          if (bVar5) {
            pcVar11 = (pcVar10->RegularExpression).regmatch.startp[pcVar10->FileIndex];
            if (pcVar11 == (char *)0x0) {
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              local_100._M_string_length = 0;
              local_100.field_2._M_local_buf[0] = '\0';
            }
            else {
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_100,pcVar11,
                         (pcVar10->RegularExpression).regmatch.endp[pcVar10->FileIndex]);
            }
            path = &pcVar12->SourceFile;
            std::__cxx11::string::operator=((string *)path,(string *)&local_100);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,
                              CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                       local_100.field_2._M_local_buf[0]) + 1);
            }
            cmsys::SystemTools::ConvertToUnixSlashes(path);
            lVar7 = std::__cxx11::string::find((char *)path,0x73ed07,0);
            if (lVar7 == -1) {
              cmsys::SystemTools::CollapseFullPath(&local_100,path);
              std::__cxx11::string::operator=((string *)path,(string *)&local_100);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p,
                                CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                         local_100.field_2._M_local_buf[0]) + 1);
              }
              cmsys::SystemTools::ReplaceString(path,local_b0._M_dataplus._M_p,"");
            }
            else {
              cmsys::SystemTools::ReplaceString(path,"/.../","");
              lVar7 = std::__cxx11::string::find((char)path,0x2f);
              if (lVar7 != -1) {
                std::__cxx11::string::substr((ulong)&local_100,(ulong)path);
                std::__cxx11::string::operator=((string *)path,(string *)&local_100);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._M_dataplus._M_p != &local_100.field_2) {
                  operator_delete(local_100._M_dataplus._M_p,
                                  CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                           local_100.field_2._M_local_buf[0]) + 1);
                }
              }
            }
            pcVar11 = (pcVar10->RegularExpression).regmatch.startp[pcVar10->LineIndex];
            if (pcVar11 == (char *)0x0) {
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              local_100._M_string_length = 0;
              local_100.field_2._M_local_buf[0] = '\0';
              iVar6 = atoi(local_100._M_dataplus._M_p);
              pcVar12->LineNumber = iVar6;
            }
            else {
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_100,pcVar11,
                         (pcVar10->RegularExpression).regmatch.endp[pcVar10->LineIndex]);
              _Var4._M_p = local_100._M_dataplus._M_p;
              iVar6 = atoi(local_100._M_dataplus._M_p);
              pcVar12->LineNumber = iVar6;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var4._M_p != &local_100.field_2) {
                operator_delete(_Var4._M_p,
                                CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                         local_100.field_2._M_local_buf[0]) + 1);
              }
            }
            break;
          }
        }
        iVar6 = local_bc;
        paVar9 = &local_100.field_2;
        if (((pcVar12->SourceFile)._M_string_length != 0) && (-1 < pcVar12->LineNumber)) {
          local_100._M_dataplus._M_p = (pointer)paVar9;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"SourceFile","");
          cmXMLWriter::StartElement(xml,&local_100);
          cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar12->SourceFile);
          cmXMLWriter::EndElement(xml);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != paVar9) {
            operator_delete(local_100._M_dataplus._M_p,
                            CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                     local_100.field_2._M_local_buf[0]) + 1);
          }
          if ((pcVar12->SourceFileTail)._M_string_length != 0) {
            local_100._M_dataplus._M_p = (pointer)paVar9;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_100,"SourceFileTail","");
            cmXMLWriter::StartElement(xml,&local_100);
            cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar12->SourceFileTail);
            cmXMLWriter::EndElement(xml);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != paVar9) {
              operator_delete(local_100._M_dataplus._M_p,
                              CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                       local_100.field_2._M_local_buf[0]) + 1);
            }
          }
          if (-1 < pcVar12->LineNumber) {
            local_100._M_dataplus._M_p = (pointer)paVar9;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_100,"SourceLineNumber","");
            cmXMLWriter::Element<int>(xml,&local_100,&pcVar12->LineNumber);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != paVar9) {
              operator_delete(local_100._M_dataplus._M_p,
                              CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                       local_100.field_2._M_local_buf[0]) + 1);
            }
          }
        }
        local_100._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"PreContext","");
        cmXMLWriter::StartElement(xml,&local_100);
        cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar12->PreContext);
        cmXMLWriter::EndElement(xml);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar9) {
          operator_delete(local_100._M_dataplus._M_p,
                          CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                   local_100.field_2._M_local_buf[0]) + 1);
        }
        local_100._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"PostContext","");
        cmXMLWriter::StartElement(xml,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar9) {
          operator_delete(local_100._M_dataplus._M_p,
                          CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                   local_100.field_2._M_local_buf[0]) + 1);
        }
        cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar12->PostContext);
        local_cc = local_cc - (int)local_b8;
        iVar6 = iVar6 - (uint)bVar1;
        iVar13 = local_cc;
        if (pcVar12->Error != false) {
          iVar13 = iVar6;
        }
        if (iVar13 == 0) {
          cmXMLWriter::Content<char[72]>
                    (xml,(char (*) [72])
                         "\nThe maximum number of reported warnings or errors has been reached!!!\n"
                    );
        }
        cmXMLWriter::EndElement(xml);
        local_100._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"RepeatCount","");
        cmXMLWriter::StartElement(xml,&local_100);
        cmXMLWriter::Content<char[2]>(xml,(char (*) [2])0x773e0b);
        cmXMLWriter::EndElement(xml);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar9) {
          operator_delete(local_100._M_dataplus._M_p,
                          CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                   local_100.field_2._M_local_buf[0]) + 1);
        }
        cmXMLWriter::EndElement(xml);
        pcVar8 = (local_c8->ErrorsAndWarnings).
                 super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      pcVar12 = pcVar12 + 1;
      iVar13 = local_cc;
    } while (pcVar12 != pcVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestBuildHandler::GenerateXMLLogScraped(cmXMLWriter& xml)
{
  std::vector<cmCTestBuildErrorWarning>& ew = this->ErrorsAndWarnings;
  std::vector<cmCTestBuildErrorWarning>::iterator it;

  // only report the first 50 warnings and first 50 errors
  int numErrorsAllowed = this->MaxErrors;
  int numWarningsAllowed = this->MaxWarnings;
  std::string srcdir = this->CTest->GetCTestConfiguration("SourceDirectory");
  // make sure the source dir is in the correct case on windows
  // via a call to collapse full path.
  srcdir = cmStrCat(cmSystemTools::CollapseFullPath(srcdir), '/');
  for (it = ew.begin();
       it != ew.end() && (numErrorsAllowed || numWarningsAllowed); it++) {
    cmCTestBuildErrorWarning* cm = &(*it);
    if ((cm->Error && numErrorsAllowed) ||
        (!cm->Error && numWarningsAllowed)) {
      if (cm->Error) {
        numErrorsAllowed--;
      } else {
        numWarningsAllowed--;
      }
      xml.StartElement(cm->Error ? "Error" : "Warning");
      xml.Element("BuildLogLine", cm->LogLine);
      xml.Element("Text", cm->Text);
      for (cmCTestCompileErrorWarningRex& rit :
           this->ErrorWarningFileLineRegex) {
        cmsys::RegularExpression* re = &rit.RegularExpression;
        if (re->find(cm->Text)) {
          cm->SourceFile = re->match(rit.FileIndex);
          // At this point we need to make this->SourceFile relative to
          // the source root of the project, so cvs links will work
          cmSystemTools::ConvertToUnixSlashes(cm->SourceFile);
          if (cm->SourceFile.find("/.../") != std::string::npos) {
            cmSystemTools::ReplaceString(cm->SourceFile, "/.../", "");
            std::string::size_type p = cm->SourceFile.find('/');
            if (p != std::string::npos) {
              cm->SourceFile =
                cm->SourceFile.substr(p + 1, cm->SourceFile.size() - p);
            }
          } else {
            // make sure it is a full path with the correct case
            cm->SourceFile = cmSystemTools::CollapseFullPath(cm->SourceFile);
            cmSystemTools::ReplaceString(cm->SourceFile, srcdir.c_str(), "");
          }
          cm->LineNumber = atoi(re->match(rit.LineIndex).c_str());
          break;
        }
      }
      if (!cm->SourceFile.empty() && cm->LineNumber >= 0) {
        if (!cm->SourceFile.empty()) {
          xml.Element("SourceFile", cm->SourceFile);
        }
        if (!cm->SourceFileTail.empty()) {
          xml.Element("SourceFileTail", cm->SourceFileTail);
        }
        if (cm->LineNumber >= 0) {
          xml.Element("SourceLineNumber", cm->LineNumber);
        }
      }
      xml.Element("PreContext", cm->PreContext);
      xml.StartElement("PostContext");
      xml.Content(cm->PostContext);
      // is this the last warning or error, if so notify
      if ((cm->Error && !numErrorsAllowed) ||
          (!cm->Error && !numWarningsAllowed)) {
        xml.Content("\nThe maximum number of reported warnings or errors "
                    "has been reached!!!\n");
      }
      xml.EndElement(); // PostContext
      xml.Element("RepeatCount", "0");
      xml.EndElement(); // "Error" / "Warning"
    }
  }
}